

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-textblock.c
# Opt level: O0

void textblock_vappend_c(textblock *tb,uint8_t attr,char *fmt,__va_list_tag *vp)

{
  char *pcVar1;
  size_t sVar2;
  size_t len;
  va_list args;
  char *pcStack_38;
  wchar_t new_length;
  char *temp_space;
  size_t temp_len;
  __va_list_tag *vp_local;
  char *fmt_local;
  uint8_t attr_local;
  textblock *tb_local;
  
  temp_space = (char *)0x80;
  pcStack_38 = (char *)mem_zalloc(0x80);
  while( true ) {
    args[0].overflow_arg_area = vp->reg_save_area;
    len._0_4_ = vp->gp_offset;
    len._4_4_ = vp->fp_offset;
    args[0]._0_8_ = vp->overflow_arg_area;
    pcVar1 = (char *)vstrnfmt(pcStack_38,(size_t)temp_space,fmt,(__va_list_tag *)&len);
    if (pcVar1 < temp_space + -1) break;
    temp_space = temp_space + 0x80;
    pcStack_38 = (char *)mem_realloc(pcStack_38,(size_t)temp_space);
  }
  sVar2 = text_mbstowcs((wchar_t *)0x0,pcStack_38,L'\0');
  args[0].reg_save_area._4_4_ = (int)sVar2;
  if (-1 < args[0].reg_save_area._4_4_) {
    textblock_resize_if_needed(tb,(long)(args[0].reg_save_area._4_4_ + 1));
    text_mbstowcs(tb->text + tb->strlen,pcStack_38,(int)tb->size - (int)tb->strlen);
    memset(tb->attrs + tb->strlen,(uint)attr,(long)args[0].reg_save_area._4_4_);
    tb->strlen = (long)args[0].reg_save_area._4_4_ + tb->strlen;
    mem_free(pcStack_38);
    return;
  }
  __assert_fail("new_length >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/z-textblock.c"
                ,0x7e,
                "void textblock_vappend_c(textblock *, uint8_t, const char *, struct __va_list_tag *)"
               );
}

Assistant:

static void textblock_vappend_c(textblock *tb, uint8_t attr, const char *fmt,
		va_list vp)
{
	size_t temp_len = TEXTBLOCK_LEN_INITIAL;
	char *temp_space = mem_zalloc(temp_len);
	int new_length;

	/* We have to format the incoming string in native (external) format
	 * re-allocating the temporary space as necessary. Once it's been
	 * successfully formatted, we can then do the conversion to wide chars
	 */
	while (1) {
		va_list args;
		size_t len;

		va_copy(args, vp);
		len = vstrnfmt(temp_space, temp_len, fmt, args);
		va_end(args);
		if (len < temp_len - 1) {
			/* Not using all space, therefore it completed */
			break;
		}

		temp_len = TEXTBLOCK_LEN_INCR(temp_len);
		temp_space = mem_realloc(temp_space, temp_len * sizeof *temp_space);
	}

	/* Get extent of addition in wide chars */
	new_length = text_mbstowcs(NULL, temp_space, 0);
	assert(new_length >= 0); /* If this fails, the string was badly formed */
	textblock_resize_if_needed(tb, new_length + 1);

	/* Convert to wide chars, into the text block buffer */
	text_mbstowcs(tb->text + tb->strlen, temp_space, tb->size - tb->strlen);
	memset(tb->attrs + tb->strlen, attr, new_length);
	tb->strlen += new_length;
	mem_free(temp_space);
}